

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::SerializeWithCachedSizesToArray
          (CodeGeneratorResponse *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  char *data;
  string *str;
  CodeGeneratorResponse_File *this_00;
  uint8 *puVar4;
  UnknownFieldSet *pUVar5;
  int local_9c;
  byte *pbStack_98;
  int i;
  uint8 *target_local;
  CodeGeneratorResponse *this_local;
  uint8 *local_28;
  byte *local_10;
  
  bVar1 = has_error(this);
  pbStack_98 = target;
  if (bVar1) {
    error_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    error_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar2,SERIALIZE);
    str = error_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_28 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_28 = target + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_28);
    pbStack_98 = io::CodedOutputStream::WriteStringToArray(str,puVar4);
  }
  for (local_9c = 0; iVar2 = file_size(this), local_9c < iVar2; local_9c = local_9c + 1) {
    this_00 = file(this,local_9c);
    uVar3 = internal::WireFormatLite::MakeTag(0xf,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_98 = (byte)uVar3;
      local_10 = pbStack_98 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_98 = (byte)uVar3 | 0x80;
      pbStack_98[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_98 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_98);
    }
    uVar3 = CodeGeneratorResponse_File::GetCachedSize(this_00);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_98 = CodeGeneratorResponse_File::SerializeWithCachedSizesToArray(this_00,puVar4);
  }
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    pbStack_98 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar5,pbStack_98);
  }
  return pbStack_98;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorResponse::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string error = 1;
  if (has_error()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->error().data(), this->error().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->error(), target);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (int i = 0; i < this->file_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        15, this->file(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}